

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDisabled(bool disabled)

{
  int *piVar1;
  float fVar2;
  int *piVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  uVar5 = GImGui->CurrentItemFlags;
  if ((char)((uVar5 & 4) >> 2) == '\0' && disabled) {
    fVar2 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar2;
    (pIVar4->Style).Alpha = fVar2 * (pIVar4->Style).DisabledAlpha;
  }
  if ((uVar5 & 4) != 0 || disabled) {
    uVar5 = uVar5 | 4;
    pIVar4->CurrentItemFlags = uVar5;
  }
  iVar8 = (pIVar4->ItemFlagsStack).Size;
  if (iVar8 == (pIVar4->ItemFlagsStack).Capacity) {
    if (iVar8 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar8 / 2 + iVar8;
    }
    iVar9 = iVar8 + 1;
    if (iVar8 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    piVar7 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar7 = *piVar7 + 1;
    piVar7 = (int *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    piVar3 = (pIVar4->ItemFlagsStack).Data;
    if (piVar3 != (int *)0x0) {
      memcpy(piVar7,piVar3,(long)(pIVar4->ItemFlagsStack).Size << 2);
      piVar3 = (pIVar4->ItemFlagsStack).Data;
      if ((piVar3 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar3,GImAllocatorUserData);
    }
    (pIVar4->ItemFlagsStack).Data = piVar7;
    (pIVar4->ItemFlagsStack).Capacity = iVar9;
    uVar5 = pIVar4->CurrentItemFlags;
    iVar8 = (pIVar4->ItemFlagsStack).Size;
  }
  else {
    piVar7 = (pIVar4->ItemFlagsStack).Data;
  }
  piVar7[iVar8] = uVar5;
  (pIVar4->ItemFlagsStack).Size = (pIVar4->ItemFlagsStack).Size + 1;
  pIVar4->DisabledStackSize = pIVar4->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}